

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

Slice __thiscall leveldb::Version::LevelFileNumIterator::key(LevelFileNumIterator *this)

{
  uint uVar1;
  const_reference ppFVar2;
  Slice SVar3;
  LevelFileNumIterator *this_local;
  
  uVar1 = (*(this->super_Iterator)._vptr_Iterator[2])();
  if ((uVar1 & 1) == 0) {
    __assert_fail("Valid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                  ,0xbe,"virtual Slice leveldb::Version::LevelFileNumIterator::key() const");
  }
  ppFVar2 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
            operator[](this->flist_,(ulong)this->index_);
  SVar3 = InternalKey::Encode(&(*ppFVar2)->largest);
  return SVar3;
}

Assistant:

Slice key() const override {
    assert(Valid());
    return (*flist_)[index_]->largest.Encode();
  }